

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O2

int FnMeanSigma_float(float *array,long npix,int nullcheck,float nullvalue,long *ngoodpix,
                     double *mean,double *sigma,int *status)

{
  float fVar1;
  long extraout_RAX;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  lVar2 = 0;
  if (0 < npix) {
    lVar2 = npix;
  }
  if (nullcheck == 0) {
    dVar5 = 0.0;
    dVar4 = 0.0;
    for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
      dVar6 = (double)array[lVar3];
      dVar5 = dVar5 + dVar6;
      dVar4 = dVar4 + dVar6 * dVar6;
    }
  }
  else {
    dVar5 = 0.0;
    npix = 0;
    dVar4 = 0.0;
    for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
      fVar1 = array[lVar3];
      if ((fVar1 != nullvalue) || (NAN(fVar1) || NAN(nullvalue))) {
        npix = npix + 1;
        dVar6 = (double)fVar1;
        dVar5 = dVar5 + dVar6;
        dVar4 = dVar4 + dVar6 * dVar6;
      }
    }
  }
  if (npix < 2) {
    if (npix == 1) {
      if (ngoodpix != (long *)0x0) {
        *ngoodpix = 1;
      }
      if (mean != (double *)0x0) {
        *mean = dVar5;
      }
    }
    else {
      if (ngoodpix != (long *)0x0) {
        *ngoodpix = 0;
      }
      if (mean != (double *)0x0) {
        *mean = 0.0;
      }
    }
    dVar4 = 0.0;
    if (sigma == (double *)0x0) goto LAB_001a6f8b;
  }
  else {
    if (ngoodpix != (long *)0x0) {
      *ngoodpix = npix;
    }
    dVar5 = dVar5 / (double)npix;
    if (mean != (double *)0x0) {
      *mean = dVar5;
    }
    if (sigma == (double *)0x0) goto LAB_001a6f8b;
    dVar4 = dVar4 / (double)npix - dVar5 * dVar5;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
      lVar2 = extraout_RAX;
    }
    else {
      dVar4 = SQRT(dVar4);
    }
  }
  *sigma = dVar4;
LAB_001a6f8b:
  return (int)lVar2;
}

Assistant:

static int FnMeanSigma_float
       (float *array,       /*  2 dimensional array of image pixels */
        long npix,          /* number of pixels in the image */
	int nullcheck,      /* check for null values, if true */
	float nullvalue,    /* value of null pixels, if nullcheck is true */

   /* returned parameters */
   
	long *ngoodpix,     /* number of non-null pixels in the image */
	double *mean,       /* returned mean value of all non-null pixels */
	double *sigma,      /* returned R.M.S. value of all non-null pixels */
	int *status)        /* error status */

/*
Compute mean and RMS sigma of the non-null pixels in the input array.
*/
{
	long ii, ngood = 0;
	float *value;
	double sum = 0., sum2 = 0., xtemp;

	value = array;
	    
	if (nullcheck) {
	        for (ii = 0; ii < npix; ii++, value++) {
		    if (*value != nullvalue) {
		        ngood++;
		        xtemp = (double) *value;
		        sum += xtemp;
		        sum2 += (xtemp * xtemp);
		    }
		}
	} else {
	        ngood = npix;
	        for (ii = 0; ii < npix; ii++, value++) {
		        xtemp = (double) *value;
		        sum += xtemp;
		        sum2 += (xtemp * xtemp);
		}
	}

	if (ngood > 1) {
		if (ngoodpix) *ngoodpix = ngood;
		xtemp = sum / ngood;
		if (mean)     *mean = xtemp;
		if (sigma)    *sigma = sqrt((sum2 / ngood) - (xtemp * xtemp));
	} else if (ngood == 1){
		if (ngoodpix) *ngoodpix = 1;
		if (mean)     *mean = sum;
		if (sigma)    *sigma = 0.0;
	} else {
		if (ngoodpix) *ngoodpix = 0;
	        if (mean)     *mean = 0.;
		if (sigma)    *sigma = 0.;
	}	    
	return(*status);
}